

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server_func(client_socket *client)

{
  int fd;
  ssize_t sVar1;
  string ret;
  char buf [8192];
  allocator local_2069;
  string local_2068;
  string local_2048;
  char local_2028 [8192];
  
  fd = client->sockfd;
  while( true ) {
    sVar1 = C_std::Read(fd,local_2028,0x2000);
    if ((int)(uint)sVar1 < 1) break;
    local_2028[(uint)sVar1 & 0x7fffffff] = '\0';
    std::__cxx11::string::string((string *)&local_2048,local_2028,&local_2069);
    algorithm(&local_2068,&local_2048);
    std::__cxx11::string::~string((string *)&local_2048);
    C_std::Write(fd,local_2068._M_dataplus._M_p,local_2068._M_string_length);
    std::__cxx11::string::~string((string *)&local_2068);
  }
  C_std::Close(fd);
  return;
}

Assistant:

void server_func(const C_std::Network::client_socket &client) {
    int client_sockfd = client.sockfd;
    char buf[BUFSIZ];
    int n;
    while ((n = Read(client_sockfd, buf, BUFSIZ)) > 0) {
        //客户端没有关闭，服务端阻塞等待客户端输入
//        int fd = Open("./test.log", O_CREAT | O_RDWR | O_APPEND, 0644);
//        Write(fd, "read:", 5);
//        Write(fd, buf, n);
        buf[n] = '\0';
        string ret = algorithm(buf);
//        Write(fd, "write:", 6);
//        Write(fd, ret.c_str(), ret.size());
//        close(fd);
        Write(client_sockfd, ret.c_str(), ret.size());
    }
    //关闭客户端socket写端
    Close(client_sockfd);
}